

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O2

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::ReReloop::create(ReReloop *this)

{
  __uniq_ptr_impl<wasm::ReReloop,_std::default_delete<wasm::ReReloop>_> _Var1;
  __uniq_ptr_impl<wasm::ReReloop,_std::default_delete<wasm::ReReloop>_> local_20;
  
  std::make_unique<wasm::ReReloop>();
  _Var1._M_t.super__Tuple_impl<0UL,_wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>.
  super__Head_base<0UL,_wasm::ReReloop_*,_false>._M_head_impl =
       local_20._M_t.super__Tuple_impl<0UL,_wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>.
       super__Head_base<0UL,_wasm::ReReloop_*,_false>._M_head_impl;
  local_20._M_t.super__Tuple_impl<0UL,_wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>.
  super__Head_base<0UL,_wasm::ReReloop_*,_false>._M_head_impl =
       (tuple<wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>)
       (_Tuple_impl<0UL,_wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>)0x0;
  (this->super_Pass)._vptr_Pass =
       (_func_int **)
       _Var1._M_t.super__Tuple_impl<0UL,_wasm::ReReloop_*,_std::default_delete<wasm::ReReloop>_>.
       super__Head_base<0UL,_wasm::ReReloop_*,_false>._M_head_impl;
  std::unique_ptr<wasm::ReReloop,_std::default_delete<wasm::ReReloop>_>::~unique_ptr
            ((unique_ptr<wasm::ReReloop,_std::default_delete<wasm::ReReloop>_> *)&local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<ReReloop>();
  }